

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Keno::selectNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  iterator iVar1;
  pointer piVar2;
  pointer piVar3;
  char cVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int currNumber;
  string line;
  istringstream istr;
  int local_200;
  int local_1fc;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1c0;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------------",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input Numbers: ",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------------",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = 0;
  local_1e8 = 0;
  local_1f8 = &local_1e8;
  std::istream::ignore();
  cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_1f8,cVar4);
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)&local_1f8,_S_in);
  local_1fc = 0;
  while( true ) {
    plVar5 = (long *)std::istream::operator>>((istream *)local_1a8,&local_1fc);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,&local_1fc);
    }
    else {
      *iVar1._M_current = local_1fc;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  uVar7 = (long)iVar1._M_current -
          (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar9 = (int)(uVar7 >> 2);
  if (iVar9 < 10) {
    iVar9 = iVar9 + -10;
    do {
      local_200 = 0;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,&local_200);
      }
      else {
        *iVar1._M_current = 0;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    uVar7 = (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  }
  if (0x28 < uVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The max selected numbers are 10!",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    selectNumbers(&local_1c0,this);
    if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = (long)piVar3 - (long)piVar2 >> 2;
  if (piVar3 != piVar2) {
    lVar6 = uVar7 + (uVar7 == 0);
    lVar8 = 0;
    do {
      uVar7 = uVar7 - (piVar2[lVar8] == 0);
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  if (uVar7 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The min selected numbers are 2!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"---------------------------------",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    selectNumbers(&local_1d8,this);
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::selectNumbers() {
	//std::cin.ignore();
	std::cout << "-----------------------------------------------" << std::endl;
	std::cout << "Input Numbers: " << std::endl;
	std::cout << "-----------------------------------------------" << std::endl;
	std::vector<int>selectNumbersBet;
	//selectNumbersBet.resize(10);

	std::string line;
	std::cin.ignore();
	getline(std::cin, line);
	
	std::istringstream istr(line);
	int currNumber = 0;
	while (istr >> currNumber) {
		selectNumbersBet.push_back(currNumber);
	}
	int count = selectNumbersBet.size();
	while (count < 10) {
		selectNumbersBet.push_back(0);
		count++;
	}
	if (selectNumbersBet.size() > 10) {
		std::cout << "---------------------------------"<< std::endl;
		std::cout << "The max selected numbers are 10!" << std::endl;
		std::cout << "---------------------------------" <<std::endl;
		selectNumbers();
	}
	size_t size = selectNumbersBet.size();
	for (int i = 0; i < selectNumbersBet.size(); i++) {
		if (selectNumbersBet[i] == 0) {
			size--;
		}
	}

	if (size < 2) {
		std::cout << "---------------------------------" << std::endl;
		std::cout << "The min selected numbers are 2!"   << std::endl;
		std::cout << "---------------------------------" << std::endl;
		selectNumbers();
	}

	/*for (int i = 0; i < selectNumbersBet.size(); ++i) {
		for (int j = 1; j < selectNumbersBet.size(); ++j) {
			if (selectNumbersBet[i] == selectNumbersBet[j]) {
				std::cout << "---------------------------------" << std::endl;
				std::cout << "The Numbers must NOT repeat!" << std::endl;
				std::cout << "---------------------------------" << std::endl;
				selectNumbers();
			}
		}
	}*/
	return selectNumbersBet;
}